

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.h
# Opt level: O1

void gimage::imageSelect<float,gimage::PixelTraits<float>>
               (Image<float,_gimage::PixelTraits<float>_> *ret,
               Image<float,_gimage::PixelTraits<float>_> *image,int j)

{
  long lVar1;
  long lVar2;
  float ***pppfVar3;
  float ***pppfVar4;
  float *pfVar5;
  float *pfVar6;
  long lVar7;
  long lVar8;
  
  Image<float,_gimage::PixelTraits<float>_>::setSize(ret,image->width,image->height,1);
  lVar1 = image->height;
  if (0 < lVar1) {
    lVar2 = image->width;
    pppfVar3 = image->img;
    pppfVar4 = ret->img;
    lVar7 = 0;
    do {
      if (0 < lVar2) {
        pfVar5 = pppfVar3[j][lVar7];
        pfVar6 = (*pppfVar4)[lVar7];
        lVar8 = 0;
        do {
          pfVar6[lVar8] = pfVar5[lVar8];
          lVar8 = lVar8 + 1;
        } while (lVar2 != lVar8);
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 != lVar1);
  }
  return;
}

Assistant:

void imageSelect(Image<T, traits> &ret, const Image<T, traits> &image, int j)
{
  ret.setSize(image.getWidth(), image.getHeight(), 1);

  for (long k=0; k<image.getHeight(); k++)
  {
    for (long i=0; i<image.getWidth(); i++)
    {
      ret.set(i, k, 0, image.get(i, k, j));
    }
  }
}